

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O1

bool Cmd::isUnsupportedTerm(void)

{
  char *pcVar1;
  bool bVar2;
  char *__s;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  long lVar6;
  string_view a;
  string_view a_00;
  string_view b;
  string_view b_00;
  
  __s = getenv("TERM");
  pcVar1 = isUnsupportedTerm::unsupported_terms[0];
  if (__s == (char *)0x0) {
    bVar5 = false;
  }
  else {
    sVar3 = strlen(__s);
    sVar4 = strlen(pcVar1);
    a._M_str = __s;
    a._M_len = sVar3;
    b._M_str = pcVar1;
    b._M_len = sVar4;
    bVar2 = iequals(a,b);
    bVar5 = true;
    if (!bVar2) {
      lVar6 = 0;
      do {
        bVar5 = lVar6 != 0x10;
        if (lVar6 == 0x10) {
          return bVar5;
        }
        pcVar1 = *(char **)((long)isUnsupportedTerm::unsupported_terms + lVar6 + 8);
        sVar3 = strlen(__s);
        sVar4 = strlen(pcVar1);
        a_00._M_str = __s;
        a_00._M_len = sVar3;
        b_00._M_str = pcVar1;
        b_00._M_len = sVar4;
        bVar2 = iequals(a_00,b_00);
        lVar6 = lVar6 + 8;
      } while (!bVar2);
    }
  }
  return bVar5;
}

Assistant:

static bool isUnsupportedTerm() {

		const char *term = getenv("TERM");
		if (!term) {
			return false;
		}

		static const char *unsupported_terms[] = {"dumb", "cons25", "emacs"};
		for (const char *t : unsupported_terms) {
			if (iequals(term, t)) {
				return true;
			}
		}

		return false;
	}